

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_layout_peek(nk_rect *bounds,nk_context *ctx)

{
  float fVar1;
  int iVar2;
  nk_panel *pnVar3;
  int in_ECX;
  
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x46ee,"void nk_layout_peek(struct nk_rect *, struct nk_context *)");
  }
  pnVar3 = ctx->current->layout;
  if (pnVar3 != (nk_panel *)0x0) {
    fVar1 = pnVar3->at_y;
    iVar2 = (pnVar3->row).index;
    if ((pnVar3->row).columns <= iVar2) {
      pnVar3->at_y = (pnVar3->row).height + fVar1;
      (pnVar3->row).index = 0;
    }
    nk_layout_widget_space(bounds,ctx,(nk_window *)0x0,in_ECX);
    if ((pnVar3->row).index == 0) {
      bounds->x = bounds->x - (pnVar3->row).item_offset;
    }
    pnVar3->at_y = fVar1;
    (pnVar3->row).index = iVar2;
    return;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x46ef,"void nk_layout_peek(struct nk_rect *, struct nk_context *)");
}

Assistant:

NK_LIB void
nk_layout_peek(struct nk_rect *bounds, struct nk_context *ctx)
{
    float y;
    int index;
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    y = layout->at_y;
    index = layout->row.index;
    if (layout->row.index >= layout->row.columns) {
        layout->at_y += layout->row.height;
        layout->row.index = 0;
    }
    nk_layout_widget_space(bounds, ctx, win, nk_false);
    if (!layout->row.index) {
        bounds->x -= layout->row.item_offset;
    }
    layout->at_y = y;
    layout->row.index = index;
}